

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savestream.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  allocator local_c1;
  string local_c0;
  string local_a0;
  StreamMetaCb_t local_80;
  SignalMetaCb_t local_60;
  DataAsDoubleCb_t local_40;
  
  signal(0xf,sigHandler);
  signal(2,sigHandler);
  if (1 < argc) {
    std::__cxx11::string::string((string *)&local_a0,argv[1],(allocator *)&local_c0);
    iVar1 = std::__cxx11::string::compare((char *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if (iVar1 != 0) {
      if ((main::streamMetaFilename_abi_cxx11_ == '\0') &&
         (iVar1 = __cxa_guard_acquire(&main::streamMetaFilename_abi_cxx11_), iVar1 != 0)) {
        main::streamMetaFilename_abi_cxx11_._M_dataplus._M_p =
             (pointer)&main::streamMetaFilename_abi_cxx11_.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&main::streamMetaFilename_abi_cxx11_,"streamMeta.dump","");
        __cxa_atexit(std::__cxx11::string::~string,&main::streamMetaFilename_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&main::streamMetaFilename_abi_cxx11_);
      }
      std::ofstream::open((string *)streamMetaFile,0x17a7b0);
      local_40.super__Function_base._M_functor._8_8_ = 0;
      local_40.super__Function_base._M_functor._M_unused._M_object = dataCb;
      local_40._M_invoker =
           std::
           _Function_handler<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long),_void_(*)(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
           ::_M_invoke;
      local_40.super__Function_base._M_manager =
           std::
           _Function_handler<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long),_void_(*)(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
           ::_M_manager;
      hbm::streaming::SignalContainer::setDataAsDoubleCb(&signalContainer,&local_40);
      if (local_40.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_40.super__Function_base._M_manager)
                  ((_Any_data *)&local_40,(_Any_data *)&local_40,__destroy_functor);
      }
      local_60.super__Function_base._M_functor._8_8_ = 0;
      local_60.super__Function_base._M_functor._M_unused._M_object = signalMetaInformationCb;
      local_60._M_invoker =
           std::
           _Function_handler<void_(hbm::streaming::SubscribedSignal_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&),_void_(*)(hbm::streaming::SubscribedSignal_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
           ::_M_invoke;
      local_60.super__Function_base._M_manager =
           std::
           _Function_handler<void_(hbm::streaming::SubscribedSignal_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&),_void_(*)(hbm::streaming::SubscribedSignal_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
           ::_M_manager;
      hbm::streaming::SignalContainer::setSignalMetaCb(&signalContainer,&local_60);
      if (local_60.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_60.super__Function_base._M_manager)
                  ((_Any_data *)&local_60,(_Any_data *)&local_60,__destroy_functor);
      }
      local_80.super__Function_base._M_functor._8_8_ = 0;
      local_80.super__Function_base._M_functor._M_unused._M_object = streamMetaInformationCb;
      local_80._M_invoker =
           std::
           _Function_handler<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&),_void_(*)(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
           ::_M_invoke;
      local_80.super__Function_base._M_manager =
           std::
           _Function_handler<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&),_void_(*)(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
           ::_M_manager;
      hbm::streaming::StreamClient::setStreamMetaCb(&streamClient,&local_80);
      if (local_80.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_80.super__Function_base._M_manager)
                  ((_Any_data *)&local_80,(_Any_data *)&local_80,__destroy_functor);
      }
      streamClient.m_pSignalContainer = &signalContainer;
      std::__cxx11::string::string((string *)&local_a0,argv[1],&local_c1);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
      hbm::streaming::StreamClient::start
                (&streamClient,&local_a0,(string *)hbm::streaming::DAQSTREAM_PORT_abi_cxx11_,
                 &local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
        return 0;
      }
      operator_delete(local_a0._M_dataplus._M_p);
      return 0;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"syntax: ",8);
  __s = *argv;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x17b250);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," <stream server address>",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	// Some signals should lead to a normal shutdown of the daq stream client. Afterwards the program exists.
	signal( SIGTERM, &sigHandler);
	signal( SIGINT, &sigHandler);

	if ((argc<2) || (std::string(argv[1])=="-h") ) {
		std::cout << "syntax: " << argv[0] << " <stream server address>" << std::endl;
		return EXIT_SUCCESS;
	}

	static const std::string streamMetaFilename = "streamMeta.dump";
	streamMetaFile.open(streamMetaFilename);

	signalContainer.setDataAsDoubleCb(dataCb);
	signalContainer.setSignalMetaCb(signalMetaInformationCb);

	streamClient.setStreamMetaCb(streamMetaInformationCb);
	streamClient.setSignalContainer(&signalContainer);

	// connect to the daq stream service and give control to the receiving function.
	// returns on signal (terminate, interrupt) buffer overrun on the server side or loss of connection.
	streamClient.start(argv[1], hbm::streaming::DAQSTREAM_PORT);
	return EXIT_SUCCESS;
}